

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::avx::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  long *plVar4;
  long lVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  _func_int *p_Var20;
  vfloat4 a0_1;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_ZMM0 [64];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vfloat4 a0;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_ZMM4 [64];
  float fVar79;
  vfloat4 b0;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 in_ZMM5 [64];
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 in_ZMM6 [64];
  float fVar93;
  undefined1 auVar94 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 in_ZMM7 [64];
  float fVar98;
  float fVar101;
  vfloat4 a1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_ZMM9 [64];
  float fVar102;
  RayQueryContext newcontext;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_e8;
  float local_d8;
  undefined1 local_c8 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auVar34 = in_ZMM7._0_16_;
  auVar42 = in_ZMM6._0_16_;
  a0.field_0 = in_ZMM4._0_16_;
  auVar59 = in_ZMM2._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  auVar33 = in_ZMM9._0_16_;
  a0_1.field_0 = in_ZMM0._0_16_;
  auVar48 = in_ZMM1._0_16_;
  uVar14 = prim->primID_;
  pGVar2 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var20 = *(_func_int **)&pGVar2->field_0x58;
  if (p_Var20 == (_func_int *)0x0) {
    uVar15 = (ulong)*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                             (long)pGVar2[1].intersectionFilterN * (ulong)uVar14);
    if (uVar15 == 0xffffffff) {
      p_Var20 = (_func_int *)0x0;
    }
    else {
      p_Var20 = pGVar2[1].super_RefCount._vptr_RefCount[uVar15];
    }
  }
  if (((p_Var20 == (_func_int *)0x0) || ((ray->mask & pGVar2->mask) == 0)) ||
     (pRVar3 = context->user, pRVar3->instID[0] != 0xffffffff)) {
    return false;
  }
  pRVar3->instID[0] = prim->instID_;
  pRVar3->instPrimID[0] = uVar14;
  uVar15 = (ulong)prim->primID_;
  if (pGVar2->numTimeSteps == 1) {
    plVar4 = *(long **)&pGVar2[1].fnumTimeSegments;
    iVar1 = (int)plVar4[4];
    if ((pGVar2->field_8).field_0x1 != '\x01') {
      if (iVar1 == 0x9134) {
        lVar5 = *plVar4;
        lVar16 = uVar15 * plVar4[2];
        auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x10 + lVar16)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar16)),0x28);
        auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x14 + lVar16)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),0x28);
        auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),0x1c);
        auVar59 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar16)),0x28);
        auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x1c + lVar16)),0x1c);
        auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar16)),0x28);
      }
      else if (iVar1 == 0x9234) {
        lVar5 = *plVar4;
        lVar16 = uVar15 * plVar4[2];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(lVar5 + 4 + lVar16);
        auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),auVar21,0x4c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar48,auVar48,0x78);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
        auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),auVar44,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar48,auVar48,0x78);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
        auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),auVar45,0x4c);
        auVar59 = vshufps_avx(auVar48,auVar48,0x78);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar16);
        auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),auVar46,0x4c);
        auVar48 = vshufps_avx(auVar48,auVar48,0x78);
      }
      else if (iVar1 == 0xb001) {
        lVar5 = *plVar4;
        lVar16 = uVar15 * plVar4[2];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
        auVar42 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),0x20);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar16);
        auVar48 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),auVar24);
        auVar34 = vshufps_avx(auVar48,auVar24,0xd8);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
        auVar48 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),auVar70);
        auVar59 = vshufps_avx(auVar48,auVar70,0xd8);
        fVar98 = *(float *)(lVar5 + 0x24 + lVar16);
        fVar93 = *(float *)(lVar5 + 0x28 + lVar16);
        fVar86 = *(float *)(lVar5 + 0x2c + lVar16);
        fVar90 = *(float *)(lVar5 + 0x30 + lVar16);
        fVar95 = fVar90 * fVar90 + fVar86 * fVar86 + fVar98 * fVar98 + fVar93 * fVar93;
        auVar48 = vrsqrtss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95));
        fVar87 = auVar48._0_4_;
        fVar95 = fVar87 * 1.5 + fVar87 * fVar87 * fVar87 * fVar95 * -0.5;
        auVar48 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar95 * fVar98)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar34,ZEXT416((uint)(fVar95 * fVar93)),0x30);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),0x10);
        auVar59 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar95 * fVar90)),0x30);
        auVar42 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar16)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar42,ZEXT416((uint)(fVar95 * fVar86)),0x30);
      }
      else if (iVar1 == 0x9244) {
        lVar5 = *plVar4;
        lVar16 = uVar15 * plVar4[2];
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar16))->v;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x10 + lVar16))->v;
        auVar59 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar16);
        auVar48 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar16);
      }
      goto LAB_0050984c;
    }
    if (iVar1 == 0x9134) {
      lVar5 = *plVar4;
      lVar16 = uVar15 * plVar4[2];
      auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x10 + lVar16)),0x1c);
      auVar33 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar16)),0x28);
      auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x14 + lVar16)),0x1c);
      auVar42 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),0x28);
      auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),0x1c);
      auVar59 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar16)),0x28);
      auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x1c + lVar16)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar16)),0x28);
    }
    else if (iVar1 == 0x9234) {
      lVar5 = *plVar4;
      lVar16 = uVar15 * plVar4[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(lVar5 + 4 + lVar16);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),auVar28,0x4c);
      auVar33 = vshufps_avx(auVar48,auVar48,0x78);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),auVar51,0x4c);
      auVar42 = vshufps_avx(auVar48,auVar48,0x78);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),auVar52,0x4c);
      auVar59 = vshufps_avx(auVar48,auVar48,0x78);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar16);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),auVar53,0x4c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar48,auVar48,0x78);
    }
    else if (iVar1 == 0xb001) {
      lVar5 = *plVar4;
      lVar16 = uVar15 * plVar4[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
      auVar48 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),0x20);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar16);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),auVar32);
      auVar34 = vshufps_avx(auVar42,auVar32,0xd8);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),auVar75);
      auVar59 = vshufps_avx(auVar42,auVar75,0xd8);
      fVar98 = *(float *)(lVar5 + 0x24 + lVar16);
      fVar93 = *(float *)(lVar5 + 0x28 + lVar16);
      fVar86 = *(float *)(lVar5 + 0x2c + lVar16);
      fVar90 = *(float *)(lVar5 + 0x30 + lVar16);
      fVar95 = fVar90 * fVar90 + fVar86 * fVar86 + fVar98 * fVar98 + fVar93 * fVar93;
      auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95));
      fVar87 = auVar42._0_4_;
      fVar95 = fVar87 * 1.5 + fVar87 * fVar87 * fVar87 * fVar95 * -0.5;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar59,ZEXT416((uint)(fVar95 * fVar98)),0x30);
      auVar33 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar95 * fVar93)),0x30);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),0x10);
      auVar59 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar95 * fVar90)),0x30);
      auVar48 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar16)),0x20);
      auVar42 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar95 * fVar86)),0x30);
    }
    else if (iVar1 == 0x9244) {
      lVar5 = *plVar4;
      lVar16 = uVar15 * plVar4[2];
      auVar33 = *(undefined1 (*) [16])(lVar5 + lVar16);
      auVar42 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar16);
      auVar59 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar16);
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x30 + lVar16);
    }
    auVar48 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
    auVar34 = vshufps_avx(auVar33,auVar33,0xff);
    auVar57 = vshufps_avx(auVar42,auVar42,0xff);
    auVar29 = vshufps_avx(auVar59,auVar59,0xff);
    fVar83 = auVar34._0_4_;
    fVar79 = auVar48._0_4_;
    fVar101 = auVar57._0_4_;
    fVar96 = auVar29._0_4_;
    fVar98 = fVar83 * fVar101 + fVar96 * fVar79;
    fVar90 = fVar83 * fVar101 - fVar96 * fVar79;
    fVar95 = fVar79 * fVar79 - fVar83 * fVar83;
    fVar87 = fVar83 * fVar96 - fVar101 * fVar79;
    fVar93 = fVar83 * fVar96 + fVar101 * fVar79;
    fVar86 = fVar101 * fVar96 + fVar83 * fVar79;
    fVar43 = fVar101 * fVar96 - fVar83 * fVar79;
    auVar48 = ZEXT416((uint)(-fVar96 * fVar96 +
                            -fVar101 * fVar101 + fVar79 * fVar79 + fVar83 * fVar83));
    auVar48 = vshufps_avx(auVar48,auVar48,0);
    auVar34 = ZEXT416((uint)(fVar98 + fVar98));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    auVar57 = ZEXT416((uint)(fVar87 + fVar87));
    auVar57 = vshufps_avx(auVar57,auVar57,0);
    fVar79 = auVar48._0_4_ * 1.0 + auVar34._0_4_ * 0.0 + auVar57._0_4_ * 0.0;
    fVar83 = auVar48._4_4_ * 0.0 + auVar34._4_4_ * 1.0 + auVar57._4_4_ * 0.0;
    fVar84 = auVar48._8_4_ * 0.0 + auVar34._8_4_ * 0.0 + auVar57._8_4_ * 1.0;
    fVar85 = auVar48._12_4_ * 0.0 + auVar34._12_4_ * 0.0 + auVar57._12_4_ * 0.0;
    auVar48 = ZEXT416((uint)(-fVar96 * fVar96 + fVar101 * fVar101 + fVar95));
    auVar48 = vshufps_avx(auVar48,auVar48,0);
    auVar34 = ZEXT416((uint)(fVar86 + fVar86));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    auVar57 = ZEXT416((uint)(fVar90 + fVar90));
    auVar57 = vshufps_avx(auVar57,auVar57,0);
    fVar86 = auVar57._0_4_ * 1.0 + auVar48._0_4_ * 0.0 + auVar34._0_4_ * 0.0;
    fVar90 = auVar57._4_4_ * 0.0 + auVar48._4_4_ * 1.0 + auVar34._4_4_ * 0.0;
    fVar91 = auVar57._8_4_ * 0.0 + auVar48._8_4_ * 0.0 + auVar34._8_4_ * 1.0;
    fVar92 = auVar57._12_4_ * 0.0 + auVar48._12_4_ * 0.0 + auVar34._12_4_ * 0.0;
    auVar48 = ZEXT416((uint)(-fVar101 * fVar101 + fVar95 + fVar96 * fVar96));
    auVar34 = vshufps_avx(auVar48,auVar48,0);
    auVar48 = ZEXT416((uint)(fVar43 + fVar43));
    auVar57 = vshufps_avx(auVar48,auVar48,0);
    auVar48 = ZEXT416((uint)(fVar93 + fVar93));
    auVar29 = vshufps_avx(auVar48,auVar48,0);
    auVar48 = vshufps_avx(auVar33,ZEXT416(0) << 0x20,0xe9);
    auVar48 = vblendps_avx(auVar48,auVar42,4);
    fVar93 = auVar29._0_4_ * 1.0 + auVar57._0_4_ * 0.0 + auVar34._0_4_ * 0.0;
    fVar95 = auVar29._4_4_ * 0.0 + auVar57._4_4_ * 1.0 + auVar34._4_4_ * 0.0;
    fVar96 = auVar29._8_4_ * 0.0 + auVar57._8_4_ * 0.0 + auVar34._8_4_ * 1.0;
    fVar97 = auVar29._12_4_ * 0.0 + auVar57._12_4_ * 0.0 + auVar34._12_4_ * 0.0;
    fVar87 = auVar48._0_4_;
    fVar43 = auVar48._4_4_;
    fVar101 = auVar48._8_4_;
    fVar98 = auVar48._12_4_;
    auVar48 = vshufps_avx(auVar33,auVar33,0);
    aVar35._0_4_ = auVar48._0_4_ * fVar79 + fVar93 * 0.0 + fVar86 * 0.0;
    aVar35._4_4_ = auVar48._4_4_ * fVar83 + fVar95 * 0.0 + fVar90 * 0.0;
    aVar35._8_4_ = auVar48._8_4_ * fVar84 + fVar96 * 0.0 + fVar91 * 0.0;
    aVar35._12_4_ = auVar48._12_4_ * fVar85 + fVar97 * 0.0 + fVar92 * 0.0;
    auVar48 = vshufps_avx(auVar42,auVar42,0);
    auVar42 = vshufps_avx(auVar42,auVar42,0x55);
    a0.field_0._0_4_ = auVar48._0_4_ * fVar79 + fVar93 * 0.0 + auVar42._0_4_ * fVar86;
    a0.field_0._4_4_ = auVar48._4_4_ * fVar83 + fVar95 * 0.0 + auVar42._4_4_ * fVar90;
    a0.field_0._8_4_ = auVar48._8_4_ * fVar84 + fVar96 * 0.0 + auVar42._8_4_ * fVar91;
    a0.field_0._12_4_ = auVar48._12_4_ * fVar85 + fVar97 * 0.0 + auVar42._12_4_ * fVar92;
    auVar48 = vshufps_avx(auVar59,auVar59,0x55);
    auVar42 = vshufps_avx(auVar59,auVar59,0xaa);
    auVar34 = vshufps_avx(auVar59,auVar59,0);
    auVar59._0_4_ = auVar34._0_4_ * fVar79 + auVar42._0_4_ * fVar93 + auVar48._0_4_ * fVar86;
    auVar59._4_4_ = auVar34._4_4_ * fVar83 + auVar42._4_4_ * fVar95 + auVar48._4_4_ * fVar90;
    auVar59._8_4_ = auVar34._8_4_ * fVar84 + auVar42._8_4_ * fVar96 + auVar48._8_4_ * fVar91;
    auVar59._12_4_ = auVar34._12_4_ * fVar85 + auVar42._12_4_ * fVar97 + auVar48._12_4_ * fVar92;
    auVar48 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
    auVar42 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
    fVar93 = auVar42._0_4_ * fVar86 + auVar48._0_4_ * fVar93;
    fVar86 = auVar42._4_4_ * fVar90 + auVar48._4_4_ * fVar95;
    fVar90 = auVar42._8_4_ * fVar91 + auVar48._8_4_ * fVar96;
    fVar95 = auVar42._12_4_ * fVar92 + auVar48._12_4_ * fVar97;
    auVar42 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0);
    a0_1.field_0 = aVar35;
  }
  else {
    fVar98 = (pGVar2->time_range).lower;
    fVar93 = (pGVar2->time_range).upper;
    auVar29 = ZEXT416((uint)fVar93);
    fVar98 = pGVar2->fnumTimeSegments * (((ray->dir).field_0.m128[3] - fVar98) / (fVar93 - fVar98));
    auVar48 = ZEXT416((uint)fVar98);
    auVar59 = vroundss_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98),9);
    auVar59 = vminss_avx(auVar59,ZEXT416((uint)(pGVar2->fnumTimeSegments + -1.0)));
    auVar57 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar59 = vmaxss_avx(ZEXT816(0) << 0x20,auVar59);
    iVar17 = (int)auVar59._0_4_;
    fVar98 = fVar98 - auVar59._0_4_;
    lVar5 = *(long *)&pGVar2[1].fnumTimeSegments;
    lVar16 = CONCAT44((int)((ulong)prim >> 0x20),iVar17) * 0x38;
    plVar4 = (long *)(lVar5 + lVar16);
    iVar1 = *(int *)(lVar5 + 0x20 + lVar16);
    auVar56 = ZEXT416((uint)fVar98);
    if ((pGVar2->field_8).field_0x1 != '\x01') {
      if (iVar1 == 0x9134) {
        lVar16 = *plVar4;
        lVar19 = plVar4[2] * uVar15;
        auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar16 + lVar19)),
                                ZEXT416(*(uint *)(lVar16 + 0x10 + lVar19)),0x1c);
        auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar16 + 0x20 + lVar19)),0x28);
        auVar59 = vinsertps_avx(ZEXT416(*(uint *)(lVar16 + 4 + lVar19)),
                                ZEXT416(*(uint *)(lVar16 + 0x14 + lVar19)),0x1c);
        auVar59 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(lVar16 + 0x24 + lVar19)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar16 + 8 + lVar19)),
                                ZEXT416(*(uint *)(lVar16 + 0x18 + lVar19)),0x1c);
        auVar57 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar16 + 0x28 + lVar19)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar19)),
                                ZEXT416(*(uint *)(lVar16 + 0x1c + lVar19)),0x1c);
        auVar29 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar16 + 0x2c + lVar19)),0x28);
      }
      else if (iVar1 == 0x9234) {
        lVar16 = *plVar4;
        lVar19 = plVar4[2] * uVar15;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(lVar16 + 4 + lVar19);
        auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar16 + lVar19)),auVar22,0x4c);
        auVar48 = vshufps_avx(auVar48,auVar48,0x78);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)(lVar16 + 0x10 + lVar19);
        auVar59 = vshufps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar19)),auVar47,0x4c);
        auVar59 = vshufps_avx(auVar59,auVar59,0x78);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)(lVar16 + 0x1c + lVar19);
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar16 + 0x18 + lVar19)),auVar58,0x4c);
        auVar57 = vshufps_avx(auVar33,auVar33,0x78);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = *(ulong *)(lVar16 + 0x28 + lVar19);
        uVar14 = *(uint *)(lVar16 + 0x24 + lVar19);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar14);
        auVar33 = vshufps_avx(ZEXT416(uVar14),auVar63,0x4c);
        auVar29 = vshufps_avx(auVar33,auVar33,0x78);
      }
      else if (iVar1 == 0xb001) {
        lVar16 = *plVar4;
        lVar19 = plVar4[2] * uVar15;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(lVar16 + 0x10 + lVar19);
        auVar59 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar16 + 8 + lVar19)),0x20);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)(lVar16 + 0x34 + lVar19);
        auVar48 = vmovlhps_avx(ZEXT416(*(uint *)(lVar16 + lVar19)),auVar26);
        auVar33 = vshufps_avx(auVar48,auVar26,0xd8);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = *(ulong *)(lVar16 + 0x1c + lVar19);
        auVar48 = vmovlhps_avx(ZEXT416(*(uint *)(lVar16 + 0x18 + lVar19)),auVar64);
        auVar57 = vshufps_avx(auVar48,auVar64,0xd8);
        fVar93 = *(float *)(lVar16 + 0x24 + lVar19);
        fVar86 = *(float *)(lVar16 + 0x28 + lVar19);
        fVar90 = *(float *)(lVar16 + 0x2c + lVar19);
        auVar42 = ZEXT416((uint)fVar90);
        fVar95 = *(float *)(lVar16 + 0x30 + lVar19);
        auVar34 = ZEXT416((uint)fVar95);
        fVar87 = fVar95 * fVar95 + fVar90 * fVar90 + fVar93 * fVar93 + fVar86 * fVar86;
        auVar48 = vrsqrtss_avx(ZEXT416((uint)fVar87),ZEXT416((uint)fVar87));
        fVar79 = auVar48._0_4_;
        fVar87 = fVar79 * 1.5 + fVar79 * fVar79 * fVar79 * fVar87 * -0.5;
        auVar29 = vinsertps_avx(auVar57,ZEXT416((uint)(fVar87 * fVar93)),0x30);
        auVar48 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar87 * fVar86)),0x30);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar87 * fVar90))
        ;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar19)),
                                   ZEXT416(*(uint *)(lVar16 + 4 + lVar19)),0x10);
        auVar57 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar87 * fVar95)),0x30);
        auVar59 = vinsertps_avx((undefined1  [16])a0.field_0,
                                ZEXT416(*(uint *)(lVar16 + 0x3c + lVar19)),0x20);
        auVar59 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar87 * fVar90)),0x30);
      }
      else if (iVar1 == 0x9244) {
        lVar16 = *plVar4;
        lVar19 = plVar4[2] * uVar15;
        auVar48 = *(undefined1 (*) [16])(lVar16 + lVar19);
        auVar59 = *(undefined1 (*) [16])(lVar16 + 0x10 + lVar19);
        auVar57 = *(undefined1 (*) [16])(lVar16 + 0x20 + lVar19);
        auVar29 = *(undefined1 (*) [16])(lVar16 + 0x30 + lVar19);
      }
      lVar16 = (ulong)(iVar17 + 1) * 0x38;
      plVar4 = (long *)(lVar5 + lVar16);
      iVar1 = *(int *)(lVar5 + 0x20 + lVar16);
      if (iVar1 == 0x9134) {
        lVar5 = *plVar4;
        lVar16 = uVar15 * plVar4[2];
        auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x10 + lVar16)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar16)),0x28);
        auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x14 + lVar16)),0x1c);
        auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),0x28);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),0x1c);
        auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar16)),0x28);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x1c + lVar16)),0x1c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar16)),0x28);
      }
      else if (iVar1 == 0x9234) {
        lVar5 = *plVar4;
        lVar16 = uVar15 * plVar4[2];
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)(lVar5 + 4 + lVar16);
        auVar42 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),auVar71,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar42,auVar42,0x78);
        auVar80._8_8_ = 0;
        auVar80._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
        auVar42 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),auVar80,0x4c);
        auVar42 = vshufps_avx(auVar42,auVar42,0x78);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
        auVar34 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),auVar81,0x4c);
        auVar34 = vshufps_avx(auVar34,auVar34,0x78);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar16);
        auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),auVar82,0x4c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar33,auVar33,0x78);
      }
      else if (iVar1 == 0xb001) {
        lVar5 = *plVar4;
        lVar16 = uVar15 * plVar4[2];
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
        auVar42 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),0x20);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar16);
        auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),auVar73);
        auVar33 = vshufps_avx(auVar34,auVar73,0xd8);
        auVar99._8_8_ = 0;
        auVar99._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
        auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),auVar99);
        auVar30 = vshufps_avx(auVar34,auVar99,0xd8);
        fVar93 = *(float *)(lVar5 + 0x24 + lVar16);
        fVar86 = *(float *)(lVar5 + 0x28 + lVar16);
        fVar90 = *(float *)(lVar5 + 0x2c + lVar16);
        fVar95 = *(float *)(lVar5 + 0x30 + lVar16);
        fVar87 = fVar95 * fVar95 + fVar90 * fVar90 + fVar93 * fVar93 + fVar86 * fVar86;
        auVar34 = vrsqrtss_avx(ZEXT416((uint)fVar87),ZEXT416((uint)fVar87));
        fVar79 = auVar34._0_4_;
        fVar87 = fVar79 * 1.5 + fVar79 * fVar79 * fVar79 * fVar87 * -0.5;
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar30,ZEXT416((uint)(fVar93 * fVar87)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar33,ZEXT416((uint)(fVar86 * fVar87)),0x30);
        auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),0x10);
        auVar34 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar95 * fVar87)),0x30);
        auVar42 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar16)),0x20);
        auVar42 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar90 * fVar87)),0x30);
      }
      else if (iVar1 == 0x9244) {
        lVar5 = *plVar4;
        lVar16 = uVar15 * plVar4[2];
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar16))->v;
        auVar42 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar16);
        auVar34 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar16);
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x30 + lVar16))->v;
      }
      auVar33 = vshufps_avx(auVar56,auVar56,0);
      fVar95 = auVar33._0_4_;
      fVar87 = auVar33._4_4_;
      fVar79 = auVar33._8_4_;
      fVar43 = auVar33._12_4_;
      auVar33 = vshufps_avx(ZEXT416((uint)(1.0 - fVar98)),ZEXT416((uint)(1.0 - fVar98)),0);
      fVar98 = auVar33._0_4_;
      fVar93 = auVar33._4_4_;
      fVar86 = auVar33._8_4_;
      fVar90 = auVar33._12_4_;
      a0_1.field_0._0_4_ = fVar98 * auVar48._0_4_ + fVar95 * a0.field_0._0_4_;
      a0_1.field_0._4_4_ = fVar93 * auVar48._4_4_ + fVar87 * a0.field_0._4_4_;
      a0_1.field_0._8_4_ = fVar86 * auVar48._8_4_ + fVar79 * a0.field_0._8_4_;
      a0_1.field_0._12_4_ = fVar90 * auVar48._12_4_ + fVar43 * a0.field_0._12_4_;
      a0.field_0._0_4_ = fVar98 * auVar59._0_4_ + fVar95 * auVar42._0_4_;
      a0.field_0._4_4_ = fVar93 * auVar59._4_4_ + fVar87 * auVar42._4_4_;
      a0.field_0._8_4_ = fVar86 * auVar59._8_4_ + fVar79 * auVar42._8_4_;
      a0.field_0._12_4_ = fVar90 * auVar59._12_4_ + fVar43 * auVar42._12_4_;
      auVar59._0_4_ = fVar98 * auVar57._0_4_ + fVar95 * auVar34._0_4_;
      auVar59._4_4_ = fVar93 * auVar57._4_4_ + fVar87 * auVar34._4_4_;
      auVar59._8_4_ = fVar86 * auVar57._8_4_ + fVar79 * auVar34._8_4_;
      auVar59._12_4_ = fVar90 * auVar57._12_4_ + fVar43 * auVar34._12_4_;
      auVar48._0_4_ = fVar98 * auVar29._0_4_ + fVar95 * b0.field_0._0_4_;
      auVar48._4_4_ = fVar93 * auVar29._4_4_ + fVar87 * b0.field_0._4_4_;
      auVar48._8_4_ = fVar86 * auVar29._8_4_ + fVar79 * b0.field_0._8_4_;
      auVar48._12_4_ = fVar90 * auVar29._12_4_ + fVar43 * b0.field_0._12_4_;
      goto LAB_0050984c;
    }
    if (iVar1 == 0x9134) {
      lVar16 = *plVar4;
      lVar19 = plVar4[2] * uVar15;
      uVar14 = *(uint *)(lVar16 + 8 + lVar19);
      auVar48 = ZEXT416(uVar14);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar16 + lVar19)),
                              ZEXT416(*(uint *)(lVar16 + 0x10 + lVar19)),0x1c);
      _local_128 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar16 + 0x20 + lVar19)),0x28);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar16 + 4 + lVar19)),
                              ZEXT416(*(uint *)(lVar16 + 0x14 + lVar19)),0x1c);
      _local_138 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar16 + 0x24 + lVar19)),0x28);
      auVar42 = vinsertps_avx(ZEXT416(uVar14),ZEXT416(*(uint *)(lVar16 + 0x18 + lVar19)),0x1c);
      _local_158 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar16 + 0x28 + lVar19)),0x28);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar19)),
                              ZEXT416(*(uint *)(lVar16 + 0x1c + lVar19)),0x1c);
      _local_148 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar16 + 0x2c + lVar19)),0x28);
    }
    else if (iVar1 == 0x9234) {
      lVar16 = *plVar4;
      lVar19 = plVar4[2] * uVar15;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(lVar16 + 4 + lVar19);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar16 + lVar19)),auVar42,0x4c);
      _local_128 = vshufps_avx(auVar48,auVar48,0x78);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(lVar16 + 0x10 + lVar19);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar19)),auVar34,0x4c);
      _local_138 = vshufps_avx(auVar48,auVar48,0x78);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(lVar16 + 0x1c + lVar19);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar16 + 0x18 + lVar19)),auVar29,0x4c);
      _local_158 = vshufps_avx(auVar48,auVar48,0x78);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(lVar16 + 0x28 + lVar19);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar16 + 0x24 + lVar19)),auVar30,0x4c);
      _local_148 = vshufps_avx(auVar48,auVar48,0x78);
      auVar48 = auVar57;
    }
    else if (iVar1 == 0xb001) {
      lVar16 = *plVar4;
      lVar19 = plVar4[2] * uVar15;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(lVar16 + 0x10 + lVar19);
      auVar48 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar16 + 8 + lVar19)),0x20);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)(lVar16 + 0x34 + lVar19);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(lVar16 + lVar19)),auVar57);
      auVar34 = vshufps_avx(auVar42,auVar57,0xd8);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)(lVar16 + 0x1c + lVar19);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(lVar16 + 0x18 + lVar19)),auVar76);
      auVar59 = vshufps_avx(auVar42,auVar76,0xd8);
      fVar93 = *(float *)(lVar16 + 0x24 + lVar19);
      fVar86 = *(float *)(lVar16 + 0x28 + lVar19);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar86);
      fVar90 = *(float *)(lVar16 + 0x2c + lVar19);
      fVar95 = *(float *)(lVar16 + 0x30 + lVar19);
      fVar87 = fVar95 * fVar95 + fVar90 * fVar90 + fVar93 * fVar93 + fVar86 * fVar86;
      auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar87),ZEXT416((uint)fVar87));
      fVar79 = auVar42._0_4_;
      auVar33 = ZEXT416((uint)(fVar79 * fVar79));
      fVar87 = fVar79 * 1.5 + fVar79 * fVar79 * fVar79 * fVar87 * -0.5;
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar87 * fVar93));
      _local_148 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar87 * fVar93)),0x30);
      _local_128 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar87 * fVar86)),0x30);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar19)),
                              ZEXT416(*(uint *)(lVar16 + 4 + lVar19)),0x10);
      _local_158 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar87 * fVar95)),0x30);
      auVar48 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar16 + 0x3c + lVar19)),0x20);
      _local_138 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar87 * fVar90)),0x30);
      auVar48 = ZEXT416((uint)(fVar87 * fVar95));
    }
    else {
      auVar48 = ZEXT816(0) << 0x20;
      if (iVar1 == 0x9244) {
        lVar16 = *plVar4;
        lVar19 = plVar4[2] * uVar15;
        _local_128 = *(undefined1 (*) [16])(lVar16 + lVar19);
        _local_138 = *(undefined1 (*) [16])(lVar16 + 0x10 + lVar19);
        _local_158 = *(undefined1 (*) [16])(lVar16 + 0x20 + lVar19);
        _local_148 = *(undefined1 (*) [16])(lVar16 + 0x30 + lVar19);
        auVar48 = auVar57;
      }
    }
    lVar16 = (ulong)(iVar17 + 1) * 0x38;
    plVar4 = (long *)(lVar5 + lVar16);
    iVar1 = *(int *)(lVar5 + 0x20 + lVar16);
    if (iVar1 == 0x9134) {
      lVar5 = *plVar4;
      lVar16 = uVar15 * plVar4[2];
      auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x10 + lVar16)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar16)),0x28);
      auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x14 + lVar16)),0x1c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),0x28);
      auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),0x1c);
      auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar16)),0x28);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x1c + lVar16)),0x1c);
      auVar33 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar16)),0x28);
    }
    else if (iVar1 == 0x9234) {
      lVar5 = *plVar4;
      lVar16 = uVar15 * plVar4[2];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar5 + 4 + lVar16);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),auVar36,0x4c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar48,auVar48,0x78);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),auVar37,0x4c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar48,auVar48,0x78);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
      auVar48 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),auVar38,0x4c);
      auVar48 = vshufps_avx(auVar48,auVar48,0x78);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar16);
      auVar42 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),auVar39,0x4c);
      auVar33 = vshufps_avx(auVar42,auVar42,0x78);
    }
    else if (iVar1 == 0xb001) {
      lVar5 = *plVar4;
      lVar16 = uVar15 * plVar4[2];
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
      auVar48 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),0x20);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar16);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),auVar54);
      auVar34 = vshufps_avx(auVar42,auVar54,0xd8);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
      auVar42 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),auVar77);
      auVar59 = vshufps_avx(auVar42,auVar77,0xd8);
      fVar93 = *(float *)(lVar5 + 0x24 + lVar16);
      fVar86 = *(float *)(lVar5 + 0x28 + lVar16);
      fVar90 = *(float *)(lVar5 + 0x2c + lVar16);
      fVar95 = *(float *)(lVar5 + 0x30 + lVar16);
      fVar87 = fVar95 * fVar95 + fVar90 * fVar90 + fVar93 * fVar93 + fVar86 * fVar86;
      auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar87),ZEXT416((uint)fVar87));
      fVar79 = auVar42._0_4_;
      fVar87 = fVar79 * 1.5 + fVar79 * fVar79 * fVar79 * fVar87 * -0.5;
      auVar33 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar87 * fVar93)),0x30);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar34,ZEXT416((uint)(fVar87 * fVar86)),0x30);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),0x10);
      auVar48 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar87 * fVar95)),0x30);
      auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar16)),0x20);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar42,ZEXT416((uint)(fVar87 * fVar90)),0x30);
    }
    else if (iVar1 == 0x9244) {
      lVar5 = *plVar4;
      lVar16 = uVar15 * plVar4[2];
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar16))->v;
      b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x10 + lVar16))->v;
      auVar48 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar16);
      auVar33 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar16);
    }
    auVar57 = vpermilps_avx(_local_148,0xff);
    auVar29 = vpermilps_avx(_local_128,0xff);
    auVar30 = vpermilps_avx(_local_138,0xff);
    auVar76 = vpermilps_avx(_local_158,0xff);
    auVar42 = vshufps_avx(auVar33,auVar33,0xff);
    auVar34 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
    auVar59 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
    local_c8 = vshufps_avx(auVar48,auVar48,0xff);
    fVar86 = auVar29._0_4_;
    fVar79 = auVar57._0_4_;
    fVar87 = auVar30._0_4_;
    fVar90 = auVar76._0_4_;
    fVar93 = fVar90 * local_c8._0_4_ +
             fVar87 * auVar59._0_4_ + auVar42._0_4_ * fVar79 + fVar86 * auVar34._0_4_;
    fVar95 = -fVar93;
    auVar57 = ZEXT416((uint)fVar93);
    auVar55._0_8_ = local_c8._0_8_ ^ 0x8000000080000000;
    auVar55._8_4_ = local_c8._8_4_ ^ 0x80000000;
    auVar55._12_4_ = local_c8._12_4_ ^ 0x80000000;
    if (fVar93 < fVar95) {
      auVar100._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
      auVar100._8_4_ = auVar42._8_4_ ^ 0x80000000;
      auVar100._12_4_ = auVar42._12_4_ ^ 0x80000000;
      auVar78._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar78._8_4_ = auVar34._8_4_ ^ 0x80000000;
      auVar78._12_4_ = auVar34._12_4_ ^ 0x80000000;
      local_c8 = auVar55;
      auVar42 = auVar100;
      auVar34 = auVar78;
    }
    auVar41._8_4_ = 0x7fffffff;
    auVar41._0_8_ = 0x7fffffff7fffffff;
    auVar41._12_4_ = 0x7fffffff;
    auVar29 = vandps_avx(auVar57,auVar41);
    fVar83 = auVar29._0_4_;
    auVar13._4_4_ = 0x80000000;
    auVar13._0_4_ = fVar95;
    auVar13._8_4_ = 0x80000000;
    auVar13._12_4_ = 0x80000000;
    auVar29 = vmaxss_avx(auVar13,auVar57);
    fVar43 = auVar29._0_4_;
    fVar93 = 1.0 - fVar83;
    if (fVar93 < 0.0) {
      fVar93 = sqrtf(fVar93);
    }
    else {
      auVar29 = vsqrtss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
      fVar93 = auVar29._0_4_;
    }
    auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,
                         ZEXT416((uint)(1.5707964 -
                                       fVar93 * (fVar83 * (fVar83 * (fVar83 * (fVar83 * (fVar83 * 
                                                  -0.0043095737 + 0.0192803) + -0.04489909) +
                                                  0.08785567) + -0.21450998) + 1.5707952))));
    auVar61._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
    auVar61._8_4_ = auVar30._8_4_ ^ 0x80000000;
    auVar61._12_4_ = auVar30._12_4_ ^ 0x80000000;
    auVar29 = vcmpss_avx(ZEXT416((uint)fVar43),ZEXT816(0) << 0x40,1);
    auVar29 = vblendvps_avx(auVar30,auVar61,auVar29);
    auVar30 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar83),1);
    auVar67._8_4_ = 0x7fc00000;
    auVar67._0_8_ = 0x7fc000007fc00000;
    auVar67._12_4_ = 0x7fc00000;
    auVar29 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar29._0_4_)),auVar67,auVar30);
    fVar84 = auVar29._0_4_ * fVar98;
    auVar29 = ZEXT416((uint)(fVar84 * 0.63661975));
    auVar29 = vroundss_avx(auVar29,auVar29,9);
    uVar14 = (uint)auVar29._0_4_;
    fVar84 = fVar84 - auVar29._0_4_ * 1.5707964;
    fVar83 = fVar84 * fVar84;
    auVar68._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
    auVar68._8_4_ = auVar59._8_4_ ^ 0x80000000;
    auVar68._12_4_ = auVar59._12_4_ ^ 0x80000000;
    auVar57 = vcmpss_avx(auVar57,ZEXT416((uint)fVar95),1);
    uVar18 = uVar14 & 3;
    fVar93 = fVar83 * (fVar83 * (fVar83 * (fVar83 * (fVar83 * -2.5963018e-07 + 2.4756235e-05) +
                                          -0.001388833) + 0.04166664) + -0.5) + 1.0;
    fVar84 = fVar84 * (fVar83 * (fVar83 * (fVar83 * (fVar83 * (fVar83 * -2.5029328e-08 +
                                                              2.7600126e-06) + -0.00019842605) +
                                          0.008333348) + -0.16666667) + 1.0);
    fVar95 = fVar84;
    if ((uVar14 & 1) != 0) {
      fVar95 = fVar93;
      fVar93 = fVar84;
    }
    auVar59 = vblendvps_avx(auVar59,auVar68,auVar57);
    if (1 < uVar18) {
      fVar95 = -fVar95;
    }
    if (uVar18 - 1 < 2) {
      fVar93 = -fVar93;
    }
    local_e8 = auVar42._0_4_;
    fVar91 = fVar79 * fVar43 - local_e8;
    local_d8 = auVar34._0_4_;
    fVar92 = fVar43 * fVar86 - local_d8;
    fVar97 = fVar43 * fVar87 - auVar59._0_4_;
    fVar7 = fVar90 * fVar43 - (float)local_c8._0_4_;
    fVar83 = fVar7 * fVar7 + fVar97 * fVar97 + fVar91 * fVar91 + fVar92 * fVar92;
    auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
    fVar84 = auVar42._0_4_;
    fVar83 = fVar84 * 1.5 + fVar84 * fVar84 * fVar84 * fVar83 * -0.5;
    fVar8 = 1.0 - fVar98;
    fVar84 = fVar79 * fVar8 + fVar98 * local_e8;
    fVar85 = fVar8 * fVar86 + fVar98 * local_d8;
    fVar101 = fVar8 * fVar87 + fVar98 * auVar59._0_4_;
    fVar98 = fVar90 * fVar8 + fVar98 * (float)local_c8._0_4_;
    fVar96 = fVar98 * fVar98 + fVar101 * fVar101 + fVar84 * fVar84 + fVar85 * fVar85;
    auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96));
    fVar102 = auVar42._0_4_;
    fVar96 = fVar102 * 1.5 + fVar102 * fVar102 * fVar102 * fVar96 * -0.5;
    auVar42 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar43),1);
    auVar42 = vblendvps_avx(ZEXT416((uint)(fVar79 * fVar93 - fVar95 * fVar83 * fVar91)),
                            ZEXT416((uint)(fVar84 * fVar96)),auVar42);
    if (0.9995 < fVar43) {
      fVar85 = fVar85 * fVar96;
      fVar101 = fVar101 * fVar96;
      fVar98 = fVar98 * fVar96;
    }
    else {
      fVar85 = fVar93 * fVar86 - fVar83 * fVar92 * fVar95;
      fVar101 = fVar93 * fVar87 - fVar83 * fVar97 * fVar95;
      fVar98 = fVar93 * fVar90 - fVar83 * fVar7 * fVar95;
    }
    auVar34 = vpermilps_avx(auVar56,0);
    local_48 = a0.field_0._0_4_;
    fStack_44 = a0.field_0._4_4_;
    fStack_40 = a0.field_0._8_4_;
    fStack_3c = a0.field_0._12_4_;
    fVar93 = auVar34._0_4_;
    fVar86 = auVar34._4_4_;
    fVar90 = auVar34._8_4_;
    fVar95 = auVar34._12_4_;
    auVar34 = vshufps_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),0);
    fVar87 = auVar34._0_4_;
    fVar79 = auVar34._4_4_;
    fVar43 = auVar34._8_4_;
    fVar83 = auVar34._12_4_;
    local_178._4_4_ = fVar79 * (float)local_128._4_4_ + fVar86 * fStack_44;
    local_178._0_4_ = fVar87 * (float)local_128._0_4_ + fVar93 * local_48;
    fStack_170 = fVar43 * fStack_120 + fVar90 * fStack_40;
    fStack_16c = fVar83 * fStack_11c + fVar95 * fStack_3c;
    local_58 = b0.field_0._0_4_;
    fStack_54 = b0.field_0._4_4_;
    fStack_50 = b0.field_0._8_4_;
    fStack_4c = b0.field_0._12_4_;
    auVar69._0_4_ = fVar87 * (float)local_138._0_4_ + fVar93 * local_58;
    auVar69._4_4_ = fVar79 * (float)local_138._4_4_ + fVar86 * fStack_54;
    auVar69._8_4_ = fVar43 * fStack_130 + fVar90 * fStack_50;
    auVar69._12_4_ = fVar83 * fStack_12c + fVar95 * fStack_4c;
    local_78 = auVar48._0_4_;
    fStack_74 = auVar48._4_4_;
    fStack_70 = auVar48._8_4_;
    fStack_6c = auVar48._12_4_;
    auVar62._0_4_ = fVar87 * (float)local_158._0_4_ + fVar93 * local_78;
    auVar62._4_4_ = fVar79 * (float)local_158._4_4_ + fVar86 * fStack_74;
    auVar62._8_4_ = fVar43 * fStack_150 + fVar90 * fStack_70;
    auVar62._12_4_ = fVar83 * fStack_14c + fVar95 * fStack_6c;
    local_68 = auVar33._0_4_;
    fStack_64 = auVar33._4_4_;
    fStack_60 = auVar33._8_4_;
    fStack_5c = auVar33._12_4_;
    auVar56._0_4_ = fVar87 * (float)local_148._0_4_ + fVar93 * local_68;
    auVar56._4_4_ = fVar79 * (float)local_148._4_4_ + fVar86 * fStack_64;
    auVar56._8_4_ = fVar43 * fStack_140 + fVar90 * fStack_60;
    auVar56._12_4_ = fVar83 * fStack_13c + fVar95 * fStack_5c;
    fVar83 = auVar42._0_4_;
    fVar93 = fVar101 * fVar85 + fVar83 * fVar98;
    fVar95 = fVar101 * fVar85 - fVar83 * fVar98;
    fVar87 = fVar83 * fVar83 - fVar85 * fVar85;
    fVar79 = fVar85 * fVar98 - fVar101 * fVar83;
    fVar86 = fVar85 * fVar98 + fVar101 * fVar83;
    fVar90 = fVar101 * fVar98 + fVar83 * fVar85;
    fVar43 = fVar101 * fVar98 - fVar83 * fVar85;
    auVar48 = ZEXT416((uint)(-fVar98 * fVar98 +
                            -fVar101 * fVar101 + fVar83 * fVar83 + fVar85 * fVar85));
    auVar48 = vshufps_avx(auVar48,auVar48,0);
    auVar42 = ZEXT416((uint)(fVar93 + fVar93));
    auVar42 = vshufps_avx(auVar42,auVar42,0);
    auVar34 = ZEXT416((uint)(fVar79 + fVar79));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    fVar79 = auVar48._0_4_ * 1.0 + auVar42._0_4_ * 0.0 + auVar34._0_4_ * 0.0;
    fVar83 = auVar48._4_4_ * 0.0 + auVar42._4_4_ * 1.0 + auVar34._4_4_ * 0.0;
    fVar84 = auVar48._8_4_ * 0.0 + auVar42._8_4_ * 0.0 + auVar34._8_4_ * 1.0;
    fVar85 = auVar48._12_4_ * 0.0 + auVar42._12_4_ * 0.0 + auVar34._12_4_ * 0.0;
    auVar48 = ZEXT416((uint)(-fVar98 * fVar98 + fVar101 * fVar101 + fVar87));
    auVar48 = vshufps_avx(auVar48,auVar48,0);
    auVar42 = ZEXT416((uint)(fVar90 + fVar90));
    auVar42 = vshufps_avx(auVar42,auVar42,0);
    auVar34 = ZEXT416((uint)(fVar95 + fVar95));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    fVar93 = auVar34._0_4_ * 1.0 + auVar48._0_4_ * 0.0 + auVar42._0_4_ * 0.0;
    fVar90 = auVar34._4_4_ * 0.0 + auVar48._4_4_ * 1.0 + auVar42._4_4_ * 0.0;
    fVar95 = auVar34._8_4_ * 0.0 + auVar48._8_4_ * 0.0 + auVar42._8_4_ * 1.0;
    fVar96 = auVar34._12_4_ * 0.0 + auVar48._12_4_ * 0.0 + auVar42._12_4_ * 0.0;
    auVar48 = ZEXT416((uint)(-fVar101 * fVar101 + fVar87 + fVar98 * fVar98));
    auVar42 = vshufps_avx(auVar48,auVar48,0);
    auVar48 = ZEXT416((uint)(fVar43 + fVar43));
    auVar34 = vshufps_avx(auVar48,auVar48,0);
    auVar48 = ZEXT416((uint)(fVar86 + fVar86));
    auVar59 = vshufps_avx(auVar48,auVar48,0);
    auVar48 = vshufps_avx(_local_178,ZEXT416(0) << 0x20,0xe9);
    auVar48 = vblendps_avx(auVar48,auVar69,4);
    fVar86 = auVar59._0_4_ * 1.0 + auVar34._0_4_ * 0.0 + auVar42._0_4_ * 0.0;
    fVar91 = auVar59._4_4_ * 0.0 + auVar34._4_4_ * 1.0 + auVar42._4_4_ * 0.0;
    fVar92 = auVar59._8_4_ * 0.0 + auVar34._8_4_ * 0.0 + auVar42._8_4_ * 1.0;
    fVar97 = auVar59._12_4_ * 0.0 + auVar34._12_4_ * 0.0 + auVar42._12_4_ * 0.0;
    fVar87 = auVar48._0_4_;
    fVar43 = auVar48._4_4_;
    fVar101 = auVar48._8_4_;
    fVar98 = auVar48._12_4_;
    auVar48 = vshufps_avx(_local_178,_local_178,0);
    a0_1.field_0._0_4_ = auVar48._0_4_ * fVar79 + fVar93 * 0.0 + fVar86 * 0.0;
    a0_1.field_0._4_4_ = auVar48._4_4_ * fVar83 + fVar90 * 0.0 + fVar91 * 0.0;
    a0_1.field_0._8_4_ = auVar48._8_4_ * fVar84 + fVar95 * 0.0 + fVar92 * 0.0;
    a0_1.field_0._12_4_ = auVar48._12_4_ * fVar85 + fVar96 * 0.0 + fVar97 * 0.0;
    auVar48 = vshufps_avx(auVar69,auVar69,0);
    auVar42 = vshufps_avx(auVar69,auVar69,0x55);
    a0.field_0._0_4_ = auVar48._0_4_ * fVar79 + auVar42._0_4_ * fVar93 + fVar86 * 0.0;
    a0.field_0._4_4_ = auVar48._4_4_ * fVar83 + auVar42._4_4_ * fVar90 + fVar91 * 0.0;
    a0.field_0._8_4_ = auVar48._8_4_ * fVar84 + auVar42._8_4_ * fVar95 + fVar92 * 0.0;
    a0.field_0._12_4_ = auVar48._12_4_ * fVar85 + auVar42._12_4_ * fVar96 + fVar97 * 0.0;
    auVar48 = vshufps_avx(auVar62,auVar62,0x55);
    auVar42 = vshufps_avx(auVar62,auVar62,0xaa);
    auVar34 = vshufps_avx(auVar62,auVar62,0);
    auVar59._0_4_ = auVar34._0_4_ * fVar79 + auVar48._0_4_ * fVar93 + fVar86 * auVar42._0_4_;
    auVar59._4_4_ = auVar34._4_4_ * fVar83 + auVar48._4_4_ * fVar90 + fVar91 * auVar42._4_4_;
    auVar59._8_4_ = auVar34._8_4_ * fVar84 + auVar48._8_4_ * fVar95 + fVar92 * auVar42._8_4_;
    auVar59._12_4_ = auVar34._12_4_ * fVar85 + auVar48._12_4_ * fVar96 + fVar97 * auVar42._12_4_;
    auVar48 = vshufps_avx(auVar56,auVar56,0xaa);
    auVar42 = vshufps_avx(auVar56,auVar56,0x55);
    fVar93 = auVar42._0_4_ * fVar93 + fVar86 * auVar48._0_4_;
    fVar86 = auVar42._4_4_ * fVar90 + fVar91 * auVar48._4_4_;
    fVar90 = auVar42._8_4_ * fVar95 + fVar92 * auVar48._8_4_;
    fVar95 = auVar42._12_4_ * fVar96 + fVar97 * auVar48._12_4_;
    auVar42 = vshufps_avx(auVar56,auVar56,0);
  }
  auVar48._0_4_ = fVar87 + 0.0 + auVar42._0_4_ * fVar79 + fVar93;
  auVar48._4_4_ = fVar43 + 0.0 + auVar42._4_4_ * fVar83 + fVar86;
  auVar48._8_4_ = fVar101 + 0.0 + auVar42._8_4_ * fVar84 + fVar90;
  auVar48._12_4_ = fVar98 + 0.0 + auVar42._12_4_ * fVar85 + fVar95;
LAB_0050984c:
  auVar42 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar34 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
  auVar88._0_4_ = auVar59._0_4_ * auVar34._0_4_;
  auVar88._4_4_ = auVar59._4_4_ * auVar34._4_4_;
  auVar88._8_4_ = auVar59._8_4_ * auVar34._8_4_;
  auVar88._12_4_ = auVar59._12_4_ * auVar34._12_4_;
  auVar94._0_4_ = a0.field_0._0_4_ * auVar42._0_4_;
  auVar94._4_4_ = a0.field_0._4_4_ * auVar42._4_4_;
  auVar94._8_4_ = a0.field_0._8_4_ * auVar42._8_4_;
  auVar94._12_4_ = a0.field_0._12_4_ * auVar42._12_4_;
  auVar29 = vsubps_avx(auVar94,auVar88);
  auVar33 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar57 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
  auVar65._0_4_ = auVar42._0_4_ * a0_1.field_0._0_4_;
  auVar65._4_4_ = auVar42._4_4_ * a0_1.field_0._4_4_;
  auVar65._8_4_ = auVar42._8_4_ * a0_1.field_0._8_4_;
  auVar65._12_4_ = auVar42._12_4_ * a0_1.field_0._12_4_;
  auVar60._0_4_ = auVar57._0_4_ * auVar59._0_4_;
  auVar60._4_4_ = auVar57._4_4_ * auVar59._4_4_;
  auVar60._8_4_ = auVar57._8_4_ * auVar59._8_4_;
  auVar60._12_4_ = auVar57._12_4_ * auVar59._12_4_;
  auVar59 = vsubps_avx(auVar60,auVar65);
  auVar66._0_4_ = auVar57._0_4_ * a0.field_0._0_4_;
  auVar66._4_4_ = auVar57._4_4_ * a0.field_0._4_4_;
  auVar66._8_4_ = auVar57._8_4_ * a0.field_0._8_4_;
  auVar66._12_4_ = auVar57._12_4_ * a0.field_0._12_4_;
  auVar74._0_4_ = a0_1.field_0._0_4_ * auVar34._0_4_;
  auVar74._4_4_ = a0_1.field_0._4_4_ * auVar34._4_4_;
  auVar74._8_4_ = a0_1.field_0._8_4_ * auVar34._8_4_;
  auVar74._12_4_ = a0_1.field_0._12_4_ * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar74,auVar66);
  auVar42 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar57 = vunpcklps_avx(auVar33,auVar42);
  auVar34 = vunpcklps_avx(auVar29,auVar34);
  auVar42 = vinsertps_avx(auVar59,auVar59,0x4a);
  auVar29 = vunpcklps_avx(auVar34,ZEXT416(auVar59._0_4_));
  auVar56 = vunpcklps_avx(auVar57,auVar42);
  auVar34 = vunpckhps_avx(auVar57,auVar42);
  auVar42 = vdpps_avx((undefined1  [16])a0_1.field_0,auVar33,0x7f);
  auVar59 = vshufps_avx(auVar42,auVar42,0);
  auVar42 = vdivps_avx(auVar56,auVar59);
  auVar34 = vdivps_avx(auVar34,auVar59);
  auVar59 = vdivps_avx(auVar29,auVar59);
  auVar33 = vshufps_avx(auVar48,auVar48,0);
  auVar57 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  fVar90 = auVar59._0_4_;
  fVar79 = auVar59._4_4_;
  fVar84 = auVar59._8_4_;
  fVar96 = auVar59._12_4_;
  fVar95 = auVar34._0_4_;
  fVar43 = auVar34._4_4_;
  fVar85 = auVar34._8_4_;
  fVar91 = auVar34._12_4_;
  fVar87 = auVar42._0_4_;
  fVar83 = auVar42._4_4_;
  fVar101 = auVar42._8_4_;
  fVar92 = auVar42._12_4_;
  auVar49._0_4_ = auVar33._0_4_ * fVar87 + auVar57._0_4_ * fVar95 + auVar48._0_4_ * fVar90;
  auVar49._4_4_ = auVar33._4_4_ * fVar83 + auVar57._4_4_ * fVar43 + auVar48._4_4_ * fVar79;
  auVar49._8_4_ = auVar33._8_4_ * fVar101 + auVar57._8_4_ * fVar85 + auVar48._8_4_ * fVar84;
  auVar49._12_4_ = auVar33._12_4_ * fVar92 + auVar57._12_4_ * fVar91 + auVar48._12_4_ * fVar96;
  uVar9 = *(undefined8 *)&(ray->org).field_0;
  uVar10 = *(undefined8 *)((long)&(ray->org).field_0 + 8);
  fVar98 = (ray->org).field_0.m128[0];
  fVar93 = (ray->org).field_0.m128[1];
  fVar86 = (ray->org).field_0.m128[2];
  auVar89._0_4_ = fVar86 * fVar90;
  auVar89._4_4_ = fVar86 * fVar79;
  auVar89._8_4_ = fVar86 * fVar84;
  auVar89._12_4_ = fVar86 * fVar96;
  auVar48 = vsubps_avx(auVar89,auVar49);
  auVar50._0_4_ = fVar98 * fVar87 + fVar93 * fVar95 + auVar48._0_4_;
  auVar50._4_4_ = fVar98 * fVar83 + fVar93 * fVar43 + auVar48._4_4_;
  auVar50._8_4_ = fVar98 * fVar101 + fVar93 * fVar85 + auVar48._8_4_;
  auVar50._12_4_ = fVar98 * fVar92 + fVar93 * fVar91 + auVar48._12_4_;
  aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
          vinsertps_avx(auVar50,ZEXT416((uint)(ray->org).field_0.m128[3]),0x30);
  uVar11 = *(undefined8 *)&(ray->dir).field_0;
  uVar12 = *(undefined8 *)((long)&(ray->dir).field_0 + 8);
  (ray->org).field_0 = aVar6;
  fVar98 = (ray->dir).field_0.m128[0];
  fVar93 = (ray->dir).field_0.m128[1];
  fVar86 = (ray->dir).field_0.m128[2];
  auVar27._0_4_ = fVar98 * fVar87 + fVar93 * fVar95 + fVar86 * fVar90;
  auVar27._4_4_ = fVar98 * fVar83 + fVar93 * fVar43 + fVar86 * fVar79;
  auVar27._8_4_ = fVar98 * fVar101 + fVar93 * fVar85 + fVar86 * fVar84;
  auVar27._12_4_ = fVar98 * fVar92 + fVar93 * fVar91 + fVar86 * fVar96;
  aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
          vinsertps_avx(auVar27,ZEXT416((uint)(ray->dir).field_0.m128[3]),0x30);
  (ray->dir).field_0 = aVar6;
  (**(code **)(p_Var20 + 0x80))(p_Var20 + 0x58,ray);
  *(undefined8 *)&(ray->org).field_0 = uVar9;
  *(undefined8 *)((long)&(ray->org).field_0 + 8) = uVar10;
  *(undefined8 *)&(ray->dir).field_0 = uVar11;
  *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uVar12;
  fVar98 = ray->tfar;
  pRVar3->instID[0] = 0xffffffff;
  pRVar3->instPrimID[0] = 0xffffffff;
  return fVar98 < 0.0;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }